

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall Tree::BuildVirtualFolderImpl(Tree *this,string *virtualFolders,string *prefix)

{
  string *virtualFolders_00;
  bool bVar1;
  reference this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  reference local_b0;
  Tree *folder;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Tree,_std::allocator<Tree>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *prefix_local;
  string *virtualFolders_local;
  Tree *this_local;
  
  local_20 = prefix;
  prefix_local = virtualFolders;
  virtualFolders_local = &this->path;
  std::operator+(&local_80,"CMake Files\\",prefix);
  std::operator+(&local_60,&local_80,&this->path);
  std::operator+(&local_40,&local_60,"\\;");
  std::__cxx11::string::operator+=((string *)prefix_local,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  __end1 = std::vector<Tree,_std::allocator<Tree>_>::begin(&this->folders);
  folder = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::end(&this->folders);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>
                                *)&folder);
    if (!bVar1) break;
    this_00 = __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>
              ::operator*(&__end1);
    virtualFolders_00 = prefix_local;
    local_b0 = this_00;
    std::operator+(&local_f0,local_20,&this->path);
    std::operator+(&local_d0,&local_f0,"\\");
    BuildVirtualFolderImpl(this_00,virtualFolders_00,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void Tree::BuildVirtualFolderImpl(std::string& virtualFolders,
                                  const std::string& prefix) const
{
  virtualFolders += "CMake Files\\" + prefix + path + "\\;";
  for (Tree const& folder : folders) {
    folder.BuildVirtualFolderImpl(virtualFolders, prefix + path + "\\");
  }
}